

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::Resize
          (Stack<rapidjson::CrtAllocator> *this,size_t newCapacity)

{
  char *__ptr;
  char *pcVar1;
  char *pcVar2;
  
  __ptr = this->stack_;
  pcVar1 = this->stackTop_;
  if (newCapacity == 0) {
    free(__ptr);
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)realloc(__ptr,newCapacity);
  }
  this->stack_ = pcVar2;
  this->stackTop_ = pcVar2 + ((long)pcVar1 - (long)__ptr);
  this->stackEnd_ = pcVar2 + newCapacity;
  return;
}

Assistant:

void Resize(size_t newCapacity) {
        const size_t size = GetSize();  // Backup the current size
        stack_ = static_cast<char*>(allocator_->Realloc(stack_, GetCapacity(), newCapacity));
        stackTop_ = stack_ + size;
        stackEnd_ = stack_ + newCapacity;
    }